

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_hse.c
# Opt level: O3

void hse03_set_ext_params(xc_func_type *p,double *ext_params)

{
  double dVar1;
  double dVar2;
  double par;
  undefined4 local_28;
  undefined4 uStack_24;
  
  dVar1 = get_ext_param(p,ext_params,0);
  dVar2 = get_ext_param(p,ext_params,1);
  par = get_ext_param(p,ext_params,2);
  local_28 = SUB84(dVar1,0);
  uStack_24 = (undefined4)((ulong)dVar1 >> 0x20);
  p->mix_coef[1] = -dVar1;
  *(undefined4 *)&p->cam_beta = local_28;
  *(undefined4 *)((long)&p->cam_beta + 4) = uStack_24;
  p->cam_omega = dVar2;
  xc_func_set_ext_params_name(*p->func_aux,"_omega",0.0);
  xc_func_set_ext_params_name(p->func_aux[1],"_omega",par);
  return;
}

Assistant:

static void
hse03_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double beta, omega_HF, omega_PBE;

  assert(p != NULL);

  beta      = get_ext_param(p, ext_params, 0);
  omega_HF  = get_ext_param(p, ext_params, 1);
  omega_PBE = get_ext_param(p, ext_params, 2);

  p->mix_coef[1] = -beta;

  p->cam_beta  = beta;
  p->cam_omega = omega_HF;

  xc_func_set_ext_params_name(p->func_aux[0], "_omega", 0.0);
  xc_func_set_ext_params_name(p->func_aux[1], "_omega", omega_PBE);
}